

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

QPoint __thiscall
QMap<Qt::MouseButton,_QPoint>::value
          (QMap<Qt::MouseButton,_QPoint> *this,MouseButton *key,QPoint *defaultValue)

{
  QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
  *pQVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
                 *)0x0) {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var2 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var2->_M_header;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        bVar5 = p_Var4[1]._M_color < *key;
        if (!bVar5) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar5];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    p_Var4 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var4 = p_Var3, *key < p_Var3[1]._M_color)) {
      p_Var4 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 != p_Var2) {
      defaultValue = (QPoint *)&p_Var4[1].field_0x4;
    }
  }
  return *defaultValue;
}

Assistant:

constexpr P get() const noexcept { return ptr; }